

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O0

array<ImVec2,_4UL> * VHMBBCalculate(vector<ImVec2,_std::allocator<ImVec2>_> *hull,double psz)

{
  ImVec2 a;
  float fVar1;
  double dVar2;
  reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  ImVec2 in_RSI;
  array<ImVec2,_4UL> *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  size_t i_3;
  ImVec2 rp;
  size_t x;
  double right;
  double left;
  double bot;
  double top;
  double angle;
  ImVec2 next;
  ImVec2 current;
  double area;
  int ni;
  size_t i_2;
  size_t i_1;
  size_t i;
  ImVec2 origin;
  ImVec2 mba;
  ImVec2 mbb;
  double mbArea;
  double cumulative_angle;
  double mbAngle;
  ImVec2 in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe90;
  float fVar7;
  float in_stack_fffffffffffffe94;
  array<ImVec2,_4UL> *in_stack_fffffffffffffea0;
  double theta;
  ulong local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  float local_108;
  float fStack_104;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  float local_e8;
  float fStack_e4;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  value_type local_c8;
  ImVec2 local_c0;
  ulong local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  value_type local_90;
  value_type local_88;
  double local_80;
  value_type local_78;
  value_type local_70;
  double local_68;
  int local_5c;
  ulong local_58;
  ulong local_50;
  double local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_10 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  std::array<ImVec2,_4UL>::array(in_stack_fffffffffffffea0);
  local_18 = 0.0;
  local_20 = 0.0;
  local_28 = 1.79769313486232e+308;
  ImVec2::ImVec2(&local_30);
  ImVec2::ImVec2(&local_38);
  ImVec2::ImVec2(&local_40);
  local_40.x = INFINITY;
  local_40.y = INFINITY;
  local_48 = 0.0;
  while( true ) {
    theta = local_48;
    dVar2 = (double)std::vector<ImVec2,_std::allocator<ImVec2>_>::size
                              ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI);
    if ((ulong)dVar2 <= (ulong)theta) break;
    pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                       ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,(size_type)local_48);
    if (pvVar3->y < local_40.y) {
      pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                         ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,(size_type)local_48);
      local_40.y = pvVar3->y;
    }
    pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                       ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,(size_type)local_48);
    if (pvVar3->x < local_40.x) {
      pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                         ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,(size_type)local_48);
      local_40.x = pvVar3->x;
    }
    local_48 = (double)((long)local_48 + 1);
  }
  local_50 = 0;
  while( true ) {
    uVar5 = local_50;
    sVar4 = std::vector<ImVec2,_std::allocator<ImVec2>_>::size
                      ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI);
    fVar7 = local_40.x;
    if (sVar4 <= uVar5) break;
    pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                       ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,local_50);
    fVar1 = local_40.y;
    pvVar3->x = pvVar3->x - fVar7;
    pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                       ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,local_50);
    pvVar3->y = pvVar3->y - fVar1;
    local_50 = local_50 + 1;
  }
  local_58 = 0;
  while( true ) {
    uVar5 = local_58;
    sVar4 = std::vector<ImVec2,_std::allocator<ImVec2>_>::size
                      ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI);
    if (sVar4 <= uVar5) break;
    local_5c = (int)local_58 + 1;
    pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                       ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,local_58);
    local_70 = *pvVar3;
    uVar5 = (ulong)local_5c;
    sVar4 = std::vector<ImVec2,_std::allocator<ImVec2>_>::size
                      ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI);
    pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                       ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,uVar5 % sVar4);
    local_90 = *pvVar3;
    local_88 = local_70;
    a.y = in_stack_fffffffffffffe94;
    a.x = in_stack_fffffffffffffe90;
    local_78 = local_90;
    local_80 = VHAngleToX(a,in_stack_fffffffffffffe88);
    local_20 = local_80 + local_20;
    local_b0 = 2.2250738585072014e-308;
    local_98 = 2.2250738585072014e-308;
    local_a8 = 1.79769313486232e+308;
    local_a0 = 1.79769313486232e+308;
    local_b8 = 0;
    while( true ) {
      uVar5 = local_b8;
      sVar4 = std::vector<ImVec2,_std::allocator<ImVec2>_>::size
                        ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI);
      if (sVar4 <= uVar5) break;
      pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                         ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,local_b8);
      local_c8 = *pvVar3;
      local_c0 = VHRotateV(in_RSI,theta);
      pvVar3 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[]
                         ((vector<ImVec2,_std::allocator<ImVec2>_> *)in_RSI,local_b8);
      pvVar3->x = local_c0.x;
      pvVar3->y = local_c0.y;
      if (local_98 < (double)local_c0.y) {
        local_98 = (double)local_c0.y;
      }
      if ((double)local_c0.y < local_a0) {
        local_a0 = (double)local_c0.y;
      }
      if (local_b0 < (double)local_c0.x) {
        local_b0 = (double)local_c0.x;
      }
      if ((double)local_c0.x < local_a8) {
        local_a8 = (double)local_c0.x;
      }
      local_b8 = local_b8 + 1;
    }
    local_68 = (local_b0 - local_a8) * (local_98 - local_a0);
    if (local_68 < local_28) {
      local_18 = local_20;
      local_28 = local_68;
      ImVec2::ImVec2(&local_d0,(float)local_a8,(float)local_a0);
      local_38 = local_d0;
      ImVec2::ImVec2(&local_d8,(float)local_b0,(float)local_98);
      local_30 = local_d8;
    }
    local_58 = local_58 + 1;
  }
  local_e8 = (float)((double)local_38.x - local_10);
  local_38.y = (float)((double)local_38.y - local_10);
  local_30.y = (float)((double)local_30.y + local_10);
  local_38.x = local_e8;
  fStack_e4 = local_38.y;
  local_30.x = (float)((double)local_30.x + local_10);
  local_e0 = VHRotateV(in_RSI,theta);
  pvVar6 = std::array<ImVec2,_4UL>::operator[]
                     ((array<ImVec2,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      (size_type)in_stack_fffffffffffffe88);
  pvVar6->x = local_e0.x;
  pvVar6->y = local_e0.y;
  ImVec2::ImVec2(&local_f8,local_30.x,local_38.y);
  local_f0 = VHRotateV(in_RSI,theta);
  pvVar6 = std::array<ImVec2,_4UL>::operator[]
                     ((array<ImVec2,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      (size_type)in_stack_fffffffffffffe88);
  pvVar6->x = local_f0.x;
  pvVar6->y = local_f0.y;
  local_108 = local_30.x;
  fStack_104 = local_30.y;
  local_100 = VHRotateV(in_RSI,theta);
  pvVar6 = std::array<ImVec2,_4UL>::operator[]
                     ((array<ImVec2,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      (size_type)in_stack_fffffffffffffe88);
  pvVar6->x = local_100.x;
  pvVar6->y = local_100.y;
  ImVec2::ImVec2(&local_118,local_38.x,local_30.y);
  local_110 = VHRotateV(in_RSI,theta);
  pvVar6 = std::array<ImVec2,_4UL>::operator[]
                     ((array<ImVec2,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      (size_type)in_stack_fffffffffffffe88);
  pvVar6->x = local_110.x;
  pvVar6->y = local_110.y;
  for (local_120 = 0; local_120 < 4; local_120 = local_120 + 1) {
    fVar7 = local_40.x;
    pvVar6 = std::array<ImVec2,_4UL>::operator[]
                       ((array<ImVec2,_4UL> *)CONCAT44(in_stack_fffffffffffffe94,local_40.x),
                        (size_type)in_stack_fffffffffffffe88);
    pvVar6->x = fVar7 + pvVar6->x;
    in_stack_fffffffffffffe94 = local_40.y;
    pvVar6 = std::array<ImVec2,_4UL>::operator[]
                       ((array<ImVec2,_4UL> *)CONCAT44(local_40.y,fVar7),
                        (size_type)in_stack_fffffffffffffe88);
    pvVar6->y = in_stack_fffffffffffffe94 + pvVar6->y;
  }
  return in_RDI;
}

Assistant:

std::array<ImVec2, 4> VHMBBCalculate(std::vector<ImVec2> hull, double psz) {
	std::array<ImVec2, 4> box;

	double mbAngle = 0, cumulative_angle = 0;
	double mbArea = DBL_MAX; // fake area to initialise
	ImVec2 mbb, mba, origin; // Box bottom left, box top right

	// Find the lowest hull point, if it's below the x-axis just bring it up to
	// compensate
	// NOTE: we're not modifying the actual hull point, just a copy
	origin.x = DBL_MAX;
	origin.y = DBL_MAX;

	// find bottom corner
	for (size_t i = 0; i < hull.size(); i++) {
		if (hull[i].y < origin.y) origin.y = hull[i].y;
		if (hull[i].x < origin.x) origin.x = hull[i].x;
	}

	// transpose
	for (size_t i = 0; i < hull.size(); i++) {
		hull[i].x -= origin.x;
		hull[i].y -= origin.y;
	}

	// rotate hull on each side and work out the smallest area
	for (size_t i = 0; i < hull.size(); i++) {
		int ni = i + 1;
		double area;

		ImVec2 current = hull[i];
		ImVec2 next    = hull[ni % hull.size()];

		double angle = VHAngleToX(current, next); // angle formed between current and next hull points;
		cumulative_angle += angle;

		double top, bot, left, right; // bounding rect limits
		top = right = DBL_MIN;
		bot = left = DBL_MAX;

		for (size_t x = 0; x < hull.size(); x++) {
			ImVec2 rp = VHRotateV(hull[x], -angle);

			hull[x] = rp;

			if (rp.y > top) top     = rp.y;
			if (rp.y < bot) bot     = rp.y;
			if (rp.x > right) right = rp.x;
			if (rp.x < left) left   = rp.x;
		}
		area = (right - left) * (top - bot);

		if (area < mbArea) {
			mbArea  = area;
			mbAngle = cumulative_angle; // total angle we've had to rotate the board
			                            // to get to this orientation;
			mba = ImVec2(left, bot);
			mbb = ImVec2(right, top);
		}
	} // for all points on hull

	// expand by pin size
	mba.x -= psz;
	mba.y -= psz;
	mbb.x += psz;
	mbb.y += psz;

	// Form our rectangle, has to be all 4 points as it's a polygon now that'll be
	// rotated
	box[0] = VHRotateV(mba, +mbAngle);
	box[1] = VHRotateV(ImVec2(mbb.x, mba.y), +mbAngle);
	box[2] = VHRotateV(mbb, +mbAngle);
	box[3] = VHRotateV(ImVec2(mba.x, mbb.y), +mbAngle);

	// Transpose MBB back
	for (size_t i = 0; i < 4; i++) {
		box[i].x += origin.x;
		box[i].y += origin.y;
	}

	return box;
}